

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O1

size_t axl::enc::EscapeEncodingDynamic::encode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size,uint_t flags)

{
  int c;
  bool bVar1;
  utf32_t uVar2;
  size_t sVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  void *pvVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  uint32_t decoderState;
  char escapeSequence [16];
  utf32_t decodeBuffer [64];
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> local_1b8;
  Array<char,_axl::sl::ArrayDetails<char>_> *local_190;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_188;
  uint_t local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined8 uStack_160;
  void *local_158;
  long local_150;
  void *local_148;
  int *local_140;
  int local_138 [66];
  
  local_170 = flags;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,0);
  local_190 = buffer;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(buffer,size);
  local_188.m_p = (char *)0x0;
  local_188.m_hdr = (Hdr *)0x0;
  local_188.m_count = 0;
  _local_168 = 0x5c;
  uStack_160 = 0;
  local_16c = 0;
  pvVar7 = (void *)(size + (long)p0);
  local_158 = pvVar7;
  do {
    piVar5 = local_138;
    if (pvVar7 <= p0) break;
    auVar9 = (**(code **)(*(long *)codec + 0x98))
                       (codec,&local_16c,piVar5,0x40,p0,(long)pvVar7 - (long)p0,0xfffd);
    lVar4 = auVar9._8_8_;
    if (lVar4 != 0) {
      piVar6 = piVar5;
      local_150 = lVar4;
      local_148 = p0;
      if (0 < auVar9._0_8_) {
        local_140 = local_138 + auVar9._0_8_;
        piVar8 = piVar5;
        do {
          c = *piVar5;
          if (c == 0x5c) {
            local_168._0_2_ = CONCAT11(0x5c,(char)local_168);
            local_1b8.m_length._0_1_ = 0;
            local_1b8.m_length._1_7_ = 0;
            local_1b8.m_isNullTerminated = false;
            local_1b8.m_p = (C *)0x0;
            local_1b8.m_hdr._0_1_ = 0;
            local_1b8.m_hdr._1_7_ = 0;
            sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                      (&local_1b8,(BufHdr *)0x0);
            local_1b8.m_length._0_1_ = (undefined1)((long)piVar8 - (long)piVar6 >> 2);
            local_1b8.m_length._1_7_ = (int7)((long)piVar8 - (long)piVar6 >> 10);
            local_1b8.m_isNullTerminated = false;
            local_1b8.m_p = piVar6;
            CharCodec::encode_utf32
                      (codec,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,&local_1b8,
                       0xfffd);
            sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1b8);
            sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                      (local_190,0xffffffffffffffff,local_188.m_p,local_188.m_count);
            local_1b8.m_length._0_1_ = 0;
            local_1b8.m_length._1_7_ = 0;
            local_1b8.m_isNullTerminated = false;
            local_1b8.m_p = (C *)0x0;
            local_1b8.m_hdr._0_1_ = 0;
            local_1b8.m_hdr._1_7_ = 0;
            sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_1b8,
                       (BufHdr *)0x0);
            local_1b8.m_p = &local_168;
            local_1b8.m_length._0_1_ = 2;
            local_1b8.m_length._1_7_ = 0;
            local_1b8.m_isNullTerminated = false;
            CharCodec::encode_utf8
                      (codec,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,
                       (StringRef_utf8 *)&local_1b8,0xfffd);
            sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_1b8);
            sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                      (local_190,0xffffffffffffffff,local_188.m_p,local_188.m_count);
LAB_0014ad36:
            piVar6 = piVar5 + 1;
          }
          else {
            bVar1 = isPrintable(c);
            if ((!bVar1) && (uVar2 = EscapeEncodingRoot::findEscapeChar(c,local_170), uVar2 != 0)) {
              local_1b8.m_length._0_1_ = 0;
              local_1b8.m_length._1_7_ = 0;
              local_1b8.m_isNullTerminated = false;
              local_1b8.m_p = (C *)0x0;
              local_1b8.m_hdr._0_1_ = 0;
              local_1b8.m_hdr._1_7_ = 0;
              sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                        (&local_1b8,(BufHdr *)0x0);
              local_1b8.m_length._0_1_ = (undefined1)((long)piVar8 - (long)piVar6 >> 2);
              local_1b8.m_length._1_7_ = (int7)((long)piVar8 - (long)piVar6 >> 10);
              local_1b8.m_isNullTerminated = false;
              local_1b8.m_p = piVar6;
              CharCodec::encode_utf32
                        (codec,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,&local_1b8,
                         0xfffd);
              sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1b8);
              sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (local_190,0xffffffffffffffff,local_188.m_p,local_188.m_count);
              if (uVar2 == c) {
                if ((local_170 & 1) == 0) {
                  sVar3 = EscapeEncodingRoot::
                          buildHexCodeEscapeSequence<axl::enc::GetHexChar_l,char>
                                    ((char *)&local_168,c);
                }
                else {
                  sVar3 = EscapeEncodingRoot::
                          buildHexCodeEscapeSequence<axl::enc::GetHexChar_u,char>
                                    ((char *)&local_168,c);
                }
              }
              else {
                local_168._0_2_ = CONCAT11((char)uVar2,(char)local_168);
                sVar3 = 2;
              }
              local_1b8.m_length._0_1_ = 0;
              local_1b8.m_length._1_7_ = 0;
              local_1b8.m_isNullTerminated = false;
              local_1b8.m_p = (C *)0x0;
              local_1b8.m_hdr._0_1_ = 0;
              local_1b8.m_hdr._1_7_ = 0;
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                        ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_1b8,
                         (BufHdr *)0x0);
              local_1b8.m_p = &local_168;
              local_1b8.m_length._0_1_ = (undefined1)sVar3;
              local_1b8.m_length._1_7_ = (int7)(sVar3 >> 8);
              local_1b8.m_isNullTerminated = false;
              CharCodec::encode_utf8
                        (codec,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,
                         (StringRef_utf8 *)&local_1b8,0xfffd);
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                        ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_1b8);
              sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (local_190,0xffffffffffffffff,local_188.m_p,local_188.m_count);
              goto LAB_0014ad36;
            }
          }
          piVar5 = piVar5 + 1;
          piVar8 = piVar8 + 1;
        } while (piVar5 < local_140);
      }
      local_1b8.m_length._0_1_ = 0;
      local_1b8.m_length._1_7_ = 0;
      local_1b8.m_isNullTerminated = false;
      local_1b8.m_p = (C *)0x0;
      local_1b8.m_hdr._0_1_ = 0;
      local_1b8.m_hdr._1_7_ = 0;
      sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                (&local_1b8,(BufHdr *)0x0);
      local_1b8.m_length._0_1_ = (undefined1)((long)piVar5 - (long)piVar6 >> 2);
      local_1b8.m_length._1_7_ = (int7)((long)piVar5 - (long)piVar6 >> 10);
      local_1b8.m_isNullTerminated = false;
      local_1b8.m_p = piVar6;
      CharCodec::encode_utf32
                (codec,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,&local_1b8,0xfffd);
      sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1b8);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                (local_190,0xffffffffffffffff,local_188.m_p,local_188.m_count);
      p0 = (void *)((long)local_148 + local_150);
      lVar4 = local_150;
      pvVar7 = local_158;
    }
  } while (lVar4 != 0);
  sVar3 = (local_190->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_188);
  return sVar3;
}

Assistant:

size_t
EscapeEncodingDynamic::encode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size,
	uint_t flags
) {
	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char escapeSequence[16] = { '\\' };

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			if (c == '\\') {
				escapeSequence[1] = '\\';
				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, 2);
				base = p + 1;
			} else {
				if (isPrintable(c))
					continue;

				utf32_t escape = findEscapeChar(c, flags);
				if (!escape)
					continue;

				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);

				size_t escapeSequenceLength;
				if (escape != c) {
					escapeSequence[1] = (char)escape;
					escapeSequenceLength = 2;
				} else {
					escapeSequenceLength = (flags & EscapeEncodingFlag_UpperCase) ?
						buildHexCodeEscapeSequence<GetHexChar_u>(escapeSequence, c) :
						buildHexCodeEscapeSequence<GetHexChar_l>(escapeSequence, c);
				}

				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, escapeSequenceLength);
				base = p + 1;
			}
		}

		appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}